

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseMumpsCoverage.cxx
# Opt level: O2

void __thiscall cmParseMumpsCoverage::InitializeMumpsFile(cmParseMumpsCoverage *this,string *file)

{
  char cVar1;
  bool bVar2;
  mapped_type *this_00;
  ulong uVar3;
  int val;
  string line;
  ifstream in;
  byte abStack_218 [488];
  
  std::ifstream::ifstream(&in,(file->_M_dataplus)._M_p,_S_in);
  if ((abStack_218[(long)_in[-3]] & 5) == 0) {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&this->Coverage->TotalCoverage,file);
    bVar2 = cmsys::SystemTools::GetLineFromStream
                      ((istream *)&in,&line,(bool *)0x0,0xffffffffffffffff);
    if (bVar2) {
      val = -1;
      std::vector<int,_std::allocator<int>_>::emplace_back<int>(this_00,&val);
LAB_001b6f6f:
      bVar2 = cmsys::SystemTools::GetLineFromStream
                        ((istream *)&in,&line,(bool *)0x0,0xffffffffffffffff);
      if (bVar2) {
        val = -1;
        for (uVar3 = 0; line._M_string_length != uVar3; uVar3 = uVar3 + 1) {
          cVar1 = line._M_dataplus._M_p[uVar3];
          if (cVar1 == '\t') goto LAB_001b6fb4;
          if (cVar1 == ';') goto LAB_001b6fc9;
          if (cVar1 == ' ') goto LAB_001b6fb4;
        }
        goto LAB_001b6fd9;
      }
    }
    std::__cxx11::string::~string((string *)&line);
  }
  std::ifstream::~ifstream(&in);
  return;
LAB_001b6fb4:
  if (line._M_string_length == uVar3) goto LAB_001b6fd9;
  if ((0x2e < (ulong)(byte)line._M_dataplus._M_p[uVar3]) ||
     ((0x400100000200U >> ((ulong)(byte)line._M_dataplus._M_p[uVar3] & 0x3f) & 1) == 0))
  goto LAB_001b6fc9;
  uVar3 = uVar3 + 1;
  goto LAB_001b6fb4;
LAB_001b6fc9:
  if ((uVar3 < line._M_string_length) && (line._M_dataplus._M_p[uVar3] != ';')) {
    val = 0;
  }
LAB_001b6fd9:
  std::vector<int,_std::allocator<int>_>::push_back(this_00,&val);
  goto LAB_001b6f6f;
}

Assistant:

void cmParseMumpsCoverage::InitializeMumpsFile(std::string& file)
{
  // initialize the coverage information for a given mumps file
  cmsys::ifstream in(file.c_str());
  if (!in) {
    return;
  }
  std::string line;
  cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
    this->Coverage.TotalCoverage[file];
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    return;
  }
  // first line of a .m file can never be run
  coverageVector.push_back(-1);
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // putting in a 0 for a line means it is executable code
    // putting in a -1 for a line means it is not executable code
    int val = -1; // assume line is not executable
    bool found = false;
    std::string::size_type i = 0;
    // (1) Search for the first whitespace or semicolon character on a line.
    // This will skip over labels if the line starts with one, or will simply
    // be the first character on the line for non-label lines.
    for (; i < line.size(); ++i) {
      if (line[i] == ' ' || line[i] == '\t' || line[i] == ';') {
        found = true;
        break;
      }
    }
    if (found) {
      // (2) If the first character found above is whitespace or a period
      // then continue the search for the first following non-whitespace
      // character.
      if (line[i] == ' ' || line[i] == '\t') {
        while (i < line.size() &&
               (line[i] == ' ' || line[i] == '\t' || line[i] == '.')) {
          i++;
        }
      }
      // (3) If the character found is not a semicolon then the line counts for
      // coverage.
      if (i < line.size() && line[i] != ';') {
        val = 0;
      }
    }
    coverageVector.push_back(val);
  }
}